

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

void duckdb_fast_float::detail::decimal_left_shift(decimal *h,uint32_t shift)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar9 = h->num_digits;
  if ((ulong)uVar9 != 0) {
    uVar10 = (uint)(*(ushort *)
                     (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)
                      ::number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2) >>
                   0xb);
    uVar2 = *(ushort *)
             (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
              number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2) & 0x7ff;
    uVar4 = (*(ushort *)
              (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
               number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2 + 2) & 0x7ff) -
            uVar2;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        if (uVar9 == uVar5) {
          uVar10 = uVar10 - 1;
          break;
        }
        if (h->digits[uVar5] !=
            number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
            number_of_digits_decimal_left_shift_table_powers_of_5[uVar5 + uVar2]) {
          uVar10 = uVar10 - (h->digits[uVar5] <
                            (byte)number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)
                                  ::number_of_digits_decimal_left_shift_table_powers_of_5
                                  [uVar5 + uVar2]);
          break;
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    uVar2 = uVar9 - 1;
    if (-1 < (int)uVar2) {
      uVar5 = (ulong)(uVar10 + uVar2);
      uVar6 = 0;
      uVar7 = (ulong)uVar2;
      do {
        uVar8 = ((ulong)h->digits[uVar7] << ((byte)shift & 0x3f)) + uVar6;
        uVar6 = uVar8 / 10;
        if ((uint)uVar5 < 0x300) {
          h->digits[uVar5] = (uint8_t)(uVar8 % 10);
        }
        else if (uVar8 % 10 != 0) {
          h->truncated = true;
        }
        uVar5 = (ulong)((uint)uVar5 - 1);
        bVar1 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar1);
      while (uVar7 = uVar6, 9 < uVar8) {
        if ((uint)uVar5 < 0x300) {
          h->digits[uVar5] = (uint8_t)(uVar7 % 10);
        }
        else if (uVar7 % 10 != 0) {
          h->truncated = true;
        }
        uVar5 = (ulong)((uint)uVar5 - 1);
        uVar6 = uVar7 / 10;
        uVar8 = uVar7;
      }
    }
    uVar9 = uVar9 + uVar10;
    uVar2 = 0x300;
    if (uVar9 < 0x300) {
      uVar2 = uVar9;
    }
    h->num_digits = uVar2;
    h->decimal_point = h->decimal_point + uVar10;
    if (uVar9 != 0) {
      iVar3 = -uVar2;
      do {
        uVar2 = uVar2 - 1;
        if (h->digits[uVar2] != '\0') {
          return;
        }
        h->num_digits = uVar2;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

inline void decimal_left_shift(decimal &h, uint32_t shift) {
  if (h.num_digits == 0) {
    return;
  }
  uint32_t num_new_digits = number_of_digits_decimal_left_shift(h, shift);
  int32_t read_index = int32_t(h.num_digits - 1);
  uint32_t write_index = h.num_digits - 1 + num_new_digits;
  uint64_t n = 0;

  while (read_index >= 0) {
    n += uint64_t(h.digits[read_index]) << shift;
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
    read_index--;
  }
  while (n > 0) {
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
  }
  h.num_digits += num_new_digits;
  if (h.num_digits > max_digits) {
    h.num_digits = max_digits;
  }
  h.decimal_point += int32_t(num_new_digits);
  trim(h);
}